

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_subtree
                 (lyd_node *root,ly_set *node_when,ly_set *node_types,ly_set *meta_types,
                 ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,uint32_t int_opts,
                 ly_ht *getnext_ht,lyd_node **diff)

{
  LY_ERR LVar1;
  lyd_node **pplVar2;
  lysc_when *plVar3;
  lyd_node_inner *local_70;
  lyd_node *LYD_TREE_DFS_next;
  ly_bool LYD_TREE_DFS_continue;
  lyd_node_inner *plStack_60;
  uint32_t impl_opts;
  lyd_node *node;
  lysc_type *type;
  lyd_meta *meta;
  LY_ERR rc;
  LY_ERR r;
  ly_set *ext_val_local;
  ly_set *ext_node_local;
  ly_set *meta_types_local;
  ly_set *node_types_local;
  ly_set *node_when_local;
  lyd_node *root_local;
  
  meta._0_4_ = LY_SUCCESS;
  plStack_60 = (lyd_node_inner *)root;
  _rc = ext_val;
  ext_val_local = ext_node;
  ext_node_local = meta_types;
  meta_types_local = node_types;
  node_types_local = node_when;
  node_when_local = (ly_set *)root;
  do {
    if (plStack_60 == (lyd_node_inner *)0x0) {
      return (LY_ERR)meta;
    }
    if (((plStack_60->field_0).node.flags & 8) != 0) {
      LVar1 = lyd_validate_nested_ext((lyd_node *)plStack_60,_rc);
      return LVar1;
    }
    if ((plStack_60->field_0).node.schema != (lysc_node *)0x0) {
      for (type = (lysc_type *)(plStack_60->field_0).node.meta; type != (lysc_type *)0x0;
          type = (lysc_type *)type->exts) {
        lyplg_ext_get_storage((lysc_ext_instance *)type->plugin,0x2e0000,8,&node);
        if ((node->parent->field_0).node.parent != (lyd_node_inner *)0x0) {
          LVar1 = ly_set_add(ext_node_local,type,'\x01',(uint32_t *)0x0);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          meta._4_4_ = 0;
        }
      }
      if (((((plStack_60->field_0).node.schema)->nodetype & 0xc) == 0) ||
         (((plStack_60->field_0).node.schema[1].parent)->parent->parent == (lysc_node *)0x0)) {
        if ((((plStack_60->field_0).node.schema)->nodetype & 0x711) != 0) {
          pplVar2 = lyd_node_child_p((lyd_node *)plStack_60);
          meta._4_4_ = lyd_validate_new(pplVar2,(plStack_60->field_0).node.schema,(lys_module *)0x0,
                                        (lysc_ext_instance *)0x0,val_opts,int_opts,getnext_ht,diff);
          if (meta._4_4_ != LY_SUCCESS) {
            if (meta._4_4_ != LY_EVALID) {
              return meta._4_4_;
            }
            meta._0_4_ = LY_EVALID;
            if ((val_opts & 4) == 0) {
              return LY_EVALID;
            }
          }
          LYD_TREE_DFS_next._4_4_ = (uint)((val_opts & 1) != 0);
          if ((val_opts & 0x10) != 0) {
            LYD_TREE_DFS_next._4_4_ = LYD_TREE_DFS_next._4_4_ | 8;
          }
          pplVar2 = lyd_node_child_p((lyd_node *)plStack_60);
          LVar1 = lyd_new_implicit((lyd_node *)plStack_60,pplVar2,(lysc_node *)0x0,(lys_module *)0x0
                                   ,(ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,
                                   LYD_TREE_DFS_next._4_4_,getnext_ht,diff);
          if (LVar1 != LY_SUCCESS) {
            return LVar1;
          }
          meta._4_4_ = 0;
        }
      }
      else {
        LVar1 = ly_set_add(meta_types_local,plStack_60,'\x01',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        meta._4_4_ = 0;
      }
      plVar3 = lysc_has_when((plStack_60->field_0).node.schema);
      if (plVar3 != (lysc_when *)0x0) {
        LVar1 = ly_set_add(node_types_local,plStack_60,'\x01',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        meta._4_4_ = 0;
      }
      LVar1 = lyd_validate_node_ext((lyd_node *)plStack_60,ext_val_local);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      meta._4_4_ = 0;
    }
    local_70 = (lyd_node_inner *)lyd_child((lyd_node *)plStack_60);
    if (local_70 == (lyd_node_inner *)0x0) {
      if (plStack_60 == (lyd_node_inner *)node_when_local) {
        return (LY_ERR)meta;
      }
      local_70 = (lyd_node_inner *)(plStack_60->field_0).node.next;
    }
    while ((local_70 == (lyd_node_inner *)0x0 &&
           (plStack_60 = (plStack_60->field_0).node.parent,
           (plStack_60->field_0).node.parent != *(lyd_node_inner **)(node_when_local + 1)))) {
      local_70 = (lyd_node_inner *)(plStack_60->field_0).node.next;
    }
    plStack_60 = local_70;
  } while( true );
}

Assistant:

static LY_ERR
lyd_validate_subtree(struct lyd_node *root, struct ly_set *node_when, struct ly_set *node_types,
        struct ly_set *meta_types, struct ly_set *ext_node, struct ly_set *ext_val, uint32_t val_opts,
        uint32_t int_opts, struct ly_ht *getnext_ht, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lyd_meta *meta;
    const struct lysc_type *type;
    struct lyd_node *node;
    uint32_t impl_opts;

    LYD_TREE_DFS_BEGIN(root, node) {
        if (node->flags & LYD_EXT) {
            /* validate using the extension instance callback */
            return lyd_validate_nested_ext(node, ext_val);
        }

        if (!node->schema) {
            /* do not validate opaque nodes */
            goto next_node;
        }

        LY_LIST_FOR(node->meta, meta) {
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            if (type->plugin->validate) {
                /* metadata type resolution */
                r = ly_set_add(meta_types, (void *)meta, 1, NULL);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            }
        }

        if ((node->schema->nodetype & LYD_NODE_TERM) && ((struct lysc_node_leaf *)node->schema)->type->plugin->validate) {
            /* node type resolution */
            r = ly_set_add(node_types, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else if (node->schema->nodetype & LYD_NODE_INNER) {
            /* new node validation, autodelete */
            r = lyd_validate_new(lyd_node_child_p(node), node->schema, NULL, NULL, val_opts, int_opts, getnext_ht, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* add nested defaults */
            impl_opts = 0;
            if (val_opts & LYD_VALIDATE_NO_STATE) {
                impl_opts |= LYD_IMPLICIT_NO_STATE;
            }
            if (val_opts & LYD_VALIDATE_NO_DEFAULTS) {
                impl_opts |= LYD_IMPLICIT_NO_DEFAULTS;
            }
            r = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, NULL, NULL, NULL, impl_opts, getnext_ht, diff);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        if (lysc_has_when(node->schema)) {
            /* when evaluation */
            r = ly_set_add(node_when, (void *)node, 1, NULL);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }

        /* store for ext instance node validation, if needed */
        r = lyd_validate_node_ext(node, ext_node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

next_node:
        LYD_TREE_DFS_END(root, node);
    }

cleanup:
    return rc;
}